

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O3

RC __thiscall RM_Manager::CloseFile(RM_Manager *this,RM_FileHandle *fileHandle)

{
  PF_FileHandle *this_00;
  undefined8 uVar1;
  RC RVar2;
  RC RVar3;
  PageNum page;
  PF_PageHandle ph;
  char *pData;
  PageNum local_3c;
  PF_PageHandle local_38;
  char *local_28;
  
  PF_PageHandle::PF_PageHandle(&local_38);
  if (fileHandle->header_modified == true) {
    this_00 = &fileHandle->pfh;
    RVar2 = PF_FileHandle::GetFirstPage(this_00,&local_38);
    if (RVar2 != 0) goto LAB_0010494b;
    RVar3 = PF_PageHandle::GetPageNum(&local_38,&local_3c);
    RVar2 = 0;
    if (RVar3 != 0) goto LAB_0010494b;
    RVar2 = PF_PageHandle::GetData(&local_38,&local_28);
    if (RVar2 != 0) {
      RVar3 = PF_FileHandle::UnpinPage(this_00,local_3c);
      if (RVar3 != 0) {
        RVar2 = RVar3;
      }
      goto LAB_0010494b;
    }
    *(undefined8 *)(local_28 + 0x10) = *(undefined8 *)&(fileHandle->header).bitmapOffset;
    uVar1 = *(undefined8 *)&(fileHandle->header).numPages;
    *(undefined8 *)local_28 = *(undefined8 *)&fileHandle->header;
    *(undefined8 *)(local_28 + 8) = uVar1;
    RVar2 = PF_FileHandle::MarkDirty(this_00,local_3c);
    if ((RVar2 != 0) || (RVar2 = PF_FileHandle::UnpinPage(this_00,local_3c), RVar2 != 0))
    goto LAB_0010494b;
  }
  RVar2 = PF_Manager::CloseFile(this->pfm,&fileHandle->pfh);
  if (RVar2 == 0) {
    if (fileHandle->openedFH == false) {
      RVar2 = 0x6b;
    }
    else {
      fileHandle->openedFH = false;
      RVar2 = 0;
    }
  }
LAB_0010494b:
  PF_PageHandle::~PF_PageHandle(&local_38);
  return RVar2;
}

Assistant:

RC RM_Manager::CloseFile  (RM_FileHandle &fileHandle) {
  RC rc;
  PF_PageHandle ph;
  PageNum page;
  char *pData;

  // If header was modified, put the first page into buffer again,
  // and update its contents, marking the page as dirty
  if(fileHandle.header_modified == true){
    if((rc = fileHandle.pfh.GetFirstPage(ph)) || ph.GetPageNum(page))
      return (rc);
    if((rc = ph.GetData(pData))){
      RC rc2;
      if((rc2 = fileHandle.pfh.UnpinPage(page)))
        return (rc2);
      return (rc);
    }
    memcpy(pData, &fileHandle.header, sizeof(struct RM_FileHeader));
    if((rc = fileHandle.pfh.MarkDirty(page)) || (rc = fileHandle.pfh.UnpinPage(page)))
      return (rc);

  }

  // Close the file
  if((rc = pfm.CloseFile(fileHandle.pfh)))
    return (rc);

  // Disassociate the fileHandle from an open file
  if((rc = CleanUpFH(fileHandle)))
    return (rc);

  return (0);
}